

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall
camp::EnumNameNotFound::EnumNameNotFound(EnumNameNotFound *this,string *name,string *enumName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"the value ",name);
  std::operator+(&bStack_78,&local_38," couldn\'t be found in metaenum ");
  std::operator+(&local_58,&bStack_78,enumName);
  Error::Error(&this->super_Error,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Error = &PTR__Error_001414f8;
  return;
}

Assistant:

EnumNameNotFound::EnumNameNotFound(const std::string& name, const std::string& enumName)
    : Error("the value " + name + " couldn't be found in metaenum " + enumName)
{
}